

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Station.cpp
# Opt level: O1

void __thiscall imrt::Station::printApertures(Station *this)

{
  int iVar1;
  long *plVar2;
  ostream *this_00;
  long lVar3;
  long lVar4;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Angle ",6);
  plVar2 = (long *)std::ostream::operator<<((ostream *)&std::cout,this->angle);
  std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
  std::ostream::put((char)plVar2);
  std::ostream::flush();
  if (0 < this->max_apertures) {
    lVar4 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"aperture ",9);
      plVar2 = (long *)std::ostream::operator<<((ostream *)&std::cout,(int)lVar4);
      std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
      std::ostream::put((char)plVar2);
      std::ostream::flush();
      iVar1 = Collimator::getXdim(this->collimator);
      if (0 < iVar1) {
        lVar3 = 0;
        do {
          this_00 = (ostream *)
                    std::ostream::operator<<
                              ((ostream *)&std::cout,
                               *(int *)(*(long *)&(this->A).
                                                  super__Vector_base<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[lVar4].
                                                  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                                  ._M_impl.super__Vector_impl_data + lVar3 * 8));
          std::__ostream_insert<char,std::char_traits<char>>(this_00,"-",1);
          plVar2 = (long *)std::ostream::operator<<
                                     ((ostream *)this_00,
                                      *(int *)(*(long *)&(this->A).
                                                                                                                  
                                                  super__Vector_base<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[lVar4].
                                                  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                                  ._M_impl.super__Vector_impl_data + 4 + lVar3 * 8))
          ;
          std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
          std::ostream::put((char)plVar2);
          std::ostream::flush();
          lVar3 = lVar3 + 1;
          iVar1 = Collimator::getXdim(this->collimator);
        } while (lVar3 < iVar1);
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 < this->max_apertures);
  }
  return;
}

Assistant:

void Station::printApertures() {
    cout << "Angle "<< angle << endl;
    for (int a=0; a<max_apertures;a++) {
      cout << "aperture " << a << endl;
      for (int i=0; i<collimator.getXdim(); i++) {
        cout << A[a][i].first << "-" << A[a][i].second << endl;
      }
    }
  }